

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed25519-sha512.c
# Opt level: O0

void ed25519_key_setup(uint8_t *out,uint8_t *sk)

{
  byte *in_RDI;
  sha512 hash;
  size_t in_stack_ffffffffffffff20;
  uint8_t *in_stack_ffffffffffffff28;
  sha512 *in_stack_ffffffffffffff30;
  
  sha512_init((sha512 *)&stack0xffffffffffffff20);
  sha512_add(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  sha512_final(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  in_RDI[0x1f] = in_RDI[0x1f] & 0x7f;
  in_RDI[0x1f] = in_RDI[0x1f] | 0x40;
  *in_RDI = *in_RDI & 0xf8;
  return;
}

Assistant:

static void
ed25519_key_setup(uint8_t out[SHA512_HASH_LENGTH],
		  const uint8_t sk[ED25519_KEY_LEN])
{
	struct sha512 hash;

	/* hash secret-key */
	sha512_init(&hash);
	sha512_add(&hash, sk, ED25519_KEY_LEN);
	sha512_final(&hash, out);

	/* delete bit 255 and set bit 254 */
	out[31] &= 0x7f;
	out[31] |= 0x40;
	/* delete 3 lowest bits */
	out[0] &= 0xf8;
}